

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_OS_Const(jx9_value *pVal,void *pUnused)

{
  int iVar1;
  undefined1 local_19e [8];
  utsname sInfo;
  void *pUnused_local;
  jx9_value *pVal_local;
  
  sInfo.__domainname._57_8_ = pUnused;
  iVar1 = uname((utsname *)local_19e);
  if (iVar1 == 0) {
    jx9_value_string(pVal,local_19e,-1);
  }
  else {
    jx9_value_string(pVal,"Unix",4);
  }
  return;
}

Assistant:

static void JX9_OS_Const(jx9_value *pVal, void *pUnused)
{
#if defined(__WINNT__)
	jx9_value_string(pVal, "WinNT", (int)sizeof("WinNT")-1);
#elif defined(__UNIXES__)
	struct utsname sInfo;
	if( uname(&sInfo) != 0 ){
		jx9_value_string(pVal, "Unix", (int)sizeof("Unix")-1);
	}else{
		jx9_value_string(pVal, sInfo.sysname, -1);
	}
#else
	jx9_value_string(pVal,"Host OS", (int)sizeof("Host OS")-1);
#endif
	SXUNUSED(pUnused);
}